

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O1

void Sbc_ManCriticalPath_rec
               (Gia_Man_t *p,int *pLevels,int iObj,int LevelFan,Vec_Bit_t *vPath,int Slack)

{
  Gia_Obj_t *pGVar1;
  Tim_Man_t *p_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int Slack_00;
  ulong uVar10;
  long lVar11;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
LAB_0053facd:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (vPath->nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    pGVar1 = p->pObjs;
    vPath->pArray[(uint)iObj >> 5] = vPath->pArray[(uint)iObj >> 5] | 1 << ((byte)iObj & 0x1f);
    uVar5 = (uint)*(undefined8 *)(pGVar1 + (uint)iObj);
    if ((~uVar5 & 0x9fffffff) != 0) {
      if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdPath.c"
                      ,0x72,
                      "void Sbc_ManCriticalPath_rec(Gia_Man_t *, int *, int, int, Vec_Bit_t *, int)"
                     );
      }
      pVVar6 = p->vMapping;
      iVar3 = pVVar6->nSize;
      if (iObj < iVar3) {
        lVar11 = 0;
        do {
          piVar2 = pVVar6->pArray;
          lVar7 = (long)piVar2[(uint)iObj];
          if ((lVar7 < 0) || (iVar3 <= piVar2[(uint)iObj])) break;
          if (piVar2[lVar7] <= lVar11) {
            return;
          }
          iVar3 = pLevels[piVar2[lVar7 + lVar11 + 1]] + Slack;
          iVar4 = iVar3 - (LevelFan + -1);
          if (LevelFan + -1 <= iVar3) {
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            Sbc_ManCriticalPath_rec
                      (p,pLevels,piVar2[lVar7 + lVar11 + 1],pLevels[piVar2[lVar7 + lVar11 + 1]],
                       vPath,iVar4);
          }
          lVar11 = lVar11 + 1;
          pVVar6 = p->vMapping;
          iVar3 = pVVar6->nSize;
        } while (iObj < iVar3);
      }
LAB_0053f9eb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    p_00 = (Tim_Man_t *)p->pManTime;
    if (p_00 == (Tim_Man_t *)0x0) {
      iVar3 = -1;
    }
    else {
      iVar3 = Tim_ManBoxForCi(p_00,(uint)((ulong)*(undefined8 *)(pGVar1 + (uint)iObj) >> 0x20) &
                                   0x1fffffff);
    }
    if (-1 < iVar3) {
      iVar4 = Tim_ManBoxInputFirst(p_00,iVar3);
      uVar5 = Tim_ManBoxInputNum(p_00,iVar3);
      if (0 < (int)uVar5) {
        lVar11 = (long)iVar4;
        uVar10 = (ulong)uVar5;
        do {
          if ((iVar4 < 0) || (p->vCos->nSize <= lVar11)) goto LAB_0053f9eb;
          uVar5 = p->vCos->pArray[lVar11];
          if (((long)(int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) goto LAB_0053facd;
          uVar8 = *(uint *)(p->pObjs + (int)uVar5) & 0x1fffffff;
          iVar3 = uVar5 - uVar8;
          iVar9 = pLevels[iVar3] + Slack;
          Slack_00 = iVar9 - (LevelFan + -1);
          if ((LevelFan + -1 <= iVar9) && (uVar5 != uVar8)) {
            if (Slack_00 < 1) {
              Slack_00 = 0;
            }
            Sbc_ManCriticalPath_rec(p,pLevels,iVar3,pLevels[iVar3],vPath,Slack_00);
          }
          lVar11 = lVar11 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
  }
  return;
}

Assistant:

void Sbc_ManCriticalPath_rec( Gia_Man_t * p, int * pLevels, int iObj, int LevelFan, Vec_Bit_t * vPath, int Slack )
{
    Gia_Obj_t * pObj; int k, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    Vec_BitWriteEntry( vPath, iObj, 1 );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        int iBox = pManTime ? Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) ) : -1;
        if ( iBox >= 0 )
        {
            int curCo = Tim_ManBoxInputFirst( pManTime, iBox );
            int nBoxInputs = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nBoxInputs; k++ )
            {
                Gia_Obj_t * pCo = Gia_ManCo( p, curCo + k );
                int iDriver = Gia_ObjFaninId0p( p, pCo );
                if ( (pLevels[iDriver]+Slack >= LevelFan-1) && iDriver )
                    Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Abc_MaxInt(0, pLevels[iDriver]+Slack-(LevelFan-1)) );
            }
        }
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        if ( pLevels[iFan]+Slack >= LevelFan-1 )
            Sbc_ManCriticalPath_rec( p, pLevels, iFan, pLevels[iFan], vPath, Abc_MaxInt(0, pLevels[iFan]+Slack-(LevelFan-1)) );
}